

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

_Bool do_cmd_open_aux(loc grid)

{
  uint32_t *puVar1;
  player *p;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  _Var2 = do_cmd_open_test(player,grid);
  if (_Var2) {
    _Var2 = square_islockeddoor(cave,grid);
    p = player;
    if (_Var2) {
      wVar3 = square_door_power((chunk *)cave,grid);
      _Var2 = no_light(player);
      wVar3 = calc_unlocking_chance(p,wVar3,_Var2);
      wVar4 = Rand_div(100);
      if (wVar4 < wVar3) {
        msgt(0x57,"You have picked the lock.");
        square_open_door(cave,grid);
        square_memorize(cave,grid);
        square_light_spot((chunk *)cave,grid);
        puVar1 = &player->upkeep->update;
        *puVar1 = *puVar1 | 0x60;
        return false;
      }
      event_signal(EVENT_INPUT_FLUSH);
      msgt(0x1c,"You failed to pick the lock.");
      return true;
    }
    square_open_door(cave,grid);
    square_memorize(cave,grid);
    square_light_spot((chunk *)cave,grid);
    puVar1 = &player->upkeep->update;
    *puVar1 = *puVar1 | 0x60;
    sound(0x17);
  }
  return false;
}

Assistant:

static bool do_cmd_open_aux(struct loc grid)
{
	bool more = false;

	/* Verify legality */
	if (!do_cmd_open_test(player, grid)) return (false);

	/* Locked door */
	if (square_islockeddoor(cave, grid)) {
		int chance = calc_unlocking_chance(player,
			square_door_power(cave, grid), no_light(player));

		if (randint0(100) < chance) {
			/* Message */
			msgt(MSG_LOCKPICK, "You have picked the lock.");

			/* Open the door */
			square_open_door(cave, grid);

			/* Update the visuals */
			square_memorize(cave, grid);
			square_light_spot(cave, grid);
			player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

			/* Experience */
			/* Removed to avoid exploit by repeatedly locking and unlocking */
			/* player_exp_gain(player, 1); */
		} else {
			event_signal(EVENT_INPUT_FLUSH);

			/* Message */
			msgt(MSG_LOCKPICK_FAIL, "You failed to pick the lock.");

			/* We may keep trying */
			more = true;
		}
	} else {
		/* Closed door */
		square_open_door(cave, grid);
		square_memorize(cave, grid);
		square_light_spot(cave, grid);
		player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
		sound(MSG_OPENDOOR);
	}

	/* Result */
	return (more);
}